

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O2

int __thiscall xercesc_4_0::DOMAttrImpl::rename(DOMAttrImpl *this,char *__old,char *__new)

{
  DOMDocument *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMAttrImpl *p;
  DOMNodeImpl *pDVar4;
  DOMNodeImpl *n2;
  long lVar5;
  XMLCh *pXVar6;
  DOMDocumentImpl *this_00;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x2c])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  pDVar1 = (this->fParent).fOwnerDocument;
  this_00 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
  if (pDVar1 == (DOMDocument *)0x0) {
    this_00 = (DOMDocumentImpl *)0x0;
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x170))(plVar3,this);
  }
  if ((__old == (char *)0x0) || (*(short *)__old == 0)) {
    pXVar6 = DOMDocumentImpl::getPooledString(this_00,(XMLCh *)__new);
    this->fName = pXVar6;
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x168))(plVar3,this);
    }
    pDVar4 = castToNodeImpl((DOMNode *)this);
    DOMNodeImpl::callUserDataHandlers(pDVar4,NODE_RENAMED,(DOMNode *)this,(DOMNode *)this);
  }
  else {
    iVar2 = (*(this_00->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])(this_00,__old,__new);
    p = (DOMAttrImpl *)CONCAT44(extraout_var_00,iVar2);
    pDVar4 = castToNodeImpl((DOMNode *)this);
    n2 = castToNodeImpl((DOMNode *)p);
    DOMDocumentImpl::transferUserData(this_00,pDVar4,n2);
    while( true ) {
      iVar2 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[7])(this);
      lVar5 = CONCAT44(extraout_var_01,iVar2);
      if (lVar5 == 0) break;
      (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x10])(this,lVar5);
      (*(p->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x11])(p,lVar5);
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x1a0))(plVar3,p);
    }
    pDVar4 = castToNodeImpl((DOMNode *)p);
    DOMNodeImpl::callUserDataHandlers(pDVar4,NODE_RENAMED,(DOMNode *)this,(DOMNode *)p);
    this = p;
  }
  return (int)this;
}

Assistant:

DOMNode* DOMAttrImpl::rename(const XMLCh* namespaceURI, const XMLCh* name)
{
    DOMElement* el = getOwnerElement();
    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;

    if (el)
        el->removeAttributeNode(this);

    if (!namespaceURI || !*namespaceURI) {
        fName = doc->getPooledString(name);

        if (el)
            el->setAttributeNode(this);

        // and fire user data NODE_RENAMED event
        castToNodeImpl(this)->callUserDataHandlers(DOMUserDataHandler::NODE_RENAMED, this, this);

        return this;
    }
    else {

        // create a new AttrNS
        DOMAttr* newAttr = doc->createAttributeNS(namespaceURI, name);

        // transfer the userData
        doc->transferUserData(castToNodeImpl(this), castToNodeImpl(newAttr));

        // move children to new node
        DOMNode* child = getFirstChild();
        while (child) {
            removeChild(child);
            newAttr->appendChild(child);
            child = getFirstChild();
        }

        // reattach attr to element
        if (el)
            el->setAttributeNodeNS(newAttr);

        // and fire user data NODE_RENAMED event
        castToNodeImpl(newAttr)->callUserDataHandlers(DOMUserDataHandler::NODE_RENAMED, this, newAttr);

        return newAttr;
    }
}